

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator%(BN *__return_storage_ptr__,BN *this,BN *bn)

{
  undefined1 local_50 [8];
  BN mod;
  BN div;
  BN *bn_local;
  BN *this_local;
  
  BN((BN *)&mod.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  BN((BN *)local_50);
  divmod(this,bn,(BN *)&mod.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(BN *)local_50);
  BN(__return_storage_ptr__,(BN *)local_50);
  ~BN((BN *)local_50);
  ~BN((BN *)&mod.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

const BN BN::operator % (const BN& bn)const
{
    BN div;
    BN mod;
    divmod(bn, div, mod);
    return move(mod);
}